

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O0

Result * CoreML::validateInputOutputTypes
                   (Result *__return_storage_ptr__,
                   RepeatedPtrField<CoreML::Specification::FeatureDescription> *features,
                   ResultReason reason,string *featureTypesDesc)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  void **local_40;
  void **local_38;
  string *psStack_28;
  anon_class_1_0_00000001 checkFeatures;
  string *featureTypesDesc_local;
  ResultReason reason_local;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features_local;
  
  psStack_28 = featureTypesDesc;
  local_38 = (void **)google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>
                      ::cbegin(features);
  local_40 = (void **)google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>
                      ::cend(features);
  bVar1 = std::
          all_of<google::protobuf::internal::RepeatedPtrIterator<CoreML::Specification::FeatureDescription_const>,CoreML::validateInputOutputTypes(google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>const&,CoreML::ResultReason,std::__cxx11::string_const&)::_lambda(CoreML::Specification::FeatureDescription_const&)_1_>
                    (local_38,local_40);
  if (bVar1) {
    Result::Result(__return_storage_ptr__);
  }
  else {
    std::operator+(&local_88,"Neural Networks require ",psStack_28);
    std::operator+(&local_68,&local_88," to be images or MLMultiArray.");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,reason,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateInputOutputTypes(const ::google::protobuf::RepeatedPtrField<Specification::FeatureDescription>& features,
                                       ResultReason reason,
                                       const std::string& featureTypesDesc) {
    auto checkFeatures = [&](const Specification::FeatureDescription& feature) {
        switch (feature.type().Type_case()) {
            case Specification::FeatureType::kImageType:
            case Specification::FeatureType::kMultiArrayType:
                return true;
            default:
                return false;
        }
    };

    if (!std::all_of(features.cbegin(), features.cend(), checkFeatures)) {
         return Result(ResultType::INVALID_MODEL_INTERFACE, reason,
                       "Neural Networks require " + featureTypesDesc + " to be images or MLMultiArray.");
    }

    return Result();
}